

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::draw_faces(Mesh *this,bool smooth)

{
  bool bVar1;
  Face *element;
  DrawStyle *this_00;
  pointer pFVar2;
  pointer pHVar3;
  pointer pVVar4;
  _Self local_b0;
  _List_node_base *local_a8;
  _List_const_iterator<CMU462::Vertex> local_a0;
  _List_const_iterator<CMU462::Vertex> local_98;
  undefined1 local_90 [8];
  Vector3D N;
  HalfedgeCIter h;
  Vector3D normal;
  DrawStyle *style;
  _Self local_40;
  FaceCIter f;
  GLfloat faceColor [4];
  GLfloat white [4];
  bool smooth_local;
  Mesh *this_local;
  
  faceColor[2] = 1.0;
  faceColor[3] = 1.0;
  f._M_node = (_List_node_base *)0x3f8000003f800000;
  faceColor[0] = 1.0;
  faceColor[1] = 1.0;
  if (((this->super_SceneObject).isGhosted & 1U) != 0) {
    faceColor[0] = 0.25;
    faceColor[1] = 0.25;
    f._M_node = (_List_node_base *)0x3e8000003e800000;
  }
  glEnable(0xb50);
  glEnable(0x4000);
  glLightfv(0x4000,0x1201,faceColor + 2);
  if (!smooth) {
    glMaterialfv(0x408,0x1201,&f);
  }
  local_40._M_node = (_List_node_base *)HalfedgeMesh::facesBegin(&this->mesh);
  while( true ) {
    style = (DrawStyle *)HalfedgeMesh::facesEnd(&this->mesh);
    bVar1 = std::operator!=(&local_40,(_Self *)&style);
    if (!bVar1) break;
    glEnable(0x8037);
    glPolygonOffset(0x3f800000);
    element = elementAddress((FaceCIter)local_40._M_node);
    this_00 = get_draw_style(this,&element->super_HalfedgeElement);
    if ((!smooth) && (this_00 != this->defaultStyle)) {
      glDisable(0xb50);
      DrawStyle::style_face(this_00);
    }
    glBegin(9);
    pFVar2 = std::_List_const_iterator<CMU462::Face>::operator->(&local_40);
    Face::normal((Vector3D *)&h,pFVar2);
    if (!smooth) {
      glNormal3dv(&h);
    }
    pFVar2 = std::_List_const_iterator<CMU462::Face>::operator->(&local_40);
    N.z = (double)Face::halfedge(pFVar2);
    do {
      if (smooth) {
        pHVar3 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                           ((_List_const_iterator<CMU462::Halfedge> *)&N.z);
        local_98._M_node = (_List_node_base *)Halfedge::vertex(pHVar3);
        pVVar4 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_98);
        Vertex::normal((Vector3D *)local_90,pVVar4);
        glNormal3d(local_90,N.x,N.y);
      }
      pHVar3 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                         ((_List_const_iterator<CMU462::Halfedge> *)&N.z);
      local_a0._M_node = (_List_node_base *)Halfedge::vertex(pHVar3);
      pVVar4 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_a0);
      glVertex3dv(&pVVar4->position);
      pHVar3 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                         ((_List_const_iterator<CMU462::Halfedge> *)&N.z);
      local_a8 = (_List_node_base *)Halfedge::next(pHVar3);
      N.z = (double)local_a8;
      pFVar2 = std::_List_const_iterator<CMU462::Face>::operator->(&local_40);
      local_b0._M_node = (_List_node_base *)Face::halfedge(pFVar2);
      bVar1 = std::operator!=((_Self *)&N.z,&local_b0);
    } while (bVar1);
    glEnd();
    if (this_00 != this->defaultStyle) {
      glEnable(0xb50);
    }
    std::_List_const_iterator<CMU462::Face>::operator++(&local_40,0);
  }
  return;
}

Assistant:

void Mesh::draw_faces(bool smooth) const {

   GLfloat white[4] = { 1., 1., 1., 1. };
   GLfloat faceColor[4] = { 1., 1., 1., 1. };
   if (isGhosted)
   {
     faceColor[0] = faceColor[1] = faceColor[2] = faceColor[3] = 0.25;
   }
   glEnable( GL_LIGHTING );
   glEnable( GL_LIGHT0 );
   glLightfv( GL_LIGHT0, GL_DIFFUSE, white );
   if (!smooth) glMaterialfv( GL_FRONT_AND_BACK, GL_DIFFUSE, faceColor);

  for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {

    // Prevent z fighting (faces bleeding into edges and points).
    glEnable(GL_POLYGON_OFFSET_FILL);
    glPolygonOffset(1.0, 1.0);

    DrawStyle* style = get_draw_style(elementAddress(f));
    if (!smooth) {
      if (style != defaultStyle) {
        glDisable(GL_LIGHTING);
        style->style_face();
      }
    }

    glBegin(GL_POLYGON);
    Vector3D normal(f->normal());
    if (!smooth) glNormal3dv(&normal.x);
    HalfedgeCIter h = f->halfedge();
    do {
      if (smooth) {
        Vector3D N = h->vertex()->normal();
        glNormal3d(N.x, N.y, N.z);
      }
      glVertex3dv(&h->vertex()->position.x);
      h = h->next();
    } while (h != f->halfedge());
    glEnd();

    if (style != defaultStyle) {
      glEnable(GL_LIGHTING);
    }
  }
}